

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

char * mg_strcasestr(char *big_str,char *small_str)

{
  int iVar1;
  size_t sVar2;
  size_t len;
  size_t small_len;
  size_t big_len;
  size_t i;
  char *small_str_local;
  char *big_str_local;
  
  sVar2 = strlen(big_str);
  len = strlen(small_str);
  if (len <= sVar2) {
    for (big_len = 0; big_len <= sVar2 - len; big_len = big_len + 1) {
      iVar1 = mg_strncasecmp(big_str + big_len,small_str,len);
      if (iVar1 == 0) {
        return big_str + big_len;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

static const char *
mg_strcasestr(const char *big_str, const char *small_str)
{
	size_t i, big_len = strlen(big_str), small_len = strlen(small_str);

	if (big_len >= small_len) {
		for (i = 0; i <= (big_len - small_len); i++) {
			if (mg_strncasecmp(big_str + i, small_str, small_len) == 0) {
				return big_str + i;
			}
		}
	}

	return NULL;
}